

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTree.cpp
# Opt level: O2

dgRedBackNode * __thiscall dgRedBackNode::Prev(dgRedBackNode *this)

{
  dgRedBackNode *pdVar1;
  bool bVar2;
  
  if (this->m_left != (dgRedBackNode *)0x0) {
    pdVar1 = Maximum(this->m_left);
    return pdVar1;
  }
  do {
    pdVar1 = this->m_parent;
    if (pdVar1 == (dgRedBackNode *)0x0) {
      return (dgRedBackNode *)0x0;
    }
    bVar2 = this == pdVar1->m_left;
    this = pdVar1;
  } while (bVar2);
  return pdVar1;
}

Assistant:

dgRedBackNode *dgRedBackNode::Prev () const
{
	if (m_left) {
		return m_left->Maximum ();
	}

	dgRedBackNode* node = (dgRedBackNode *)this;
	dgRedBackNode* ptr = m_parent;
	for (; ptr && node == ptr->m_left; ptr = ptr->m_parent) {
		node = ptr;
	}
	return ptr;

}